

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::ImageLookup
          (PortalImageInfiniteLight *this,Point2f *st,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  Float *pFVar4;
  undefined8 *in_RSI;
  long in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  int c;
  RGB rgb;
  SampledSpectrum *s;
  Float a;
  Float in_stack_ffffffffffffff74;
  Image *in_stack_ffffffffffffff80;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffff88;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff90;
  SampledWavelengths *in_stack_ffffffffffffff98;
  RGBSpectrum *in_stack_ffffffffffffffa0;
  RGB *in_stack_ffffffffffffffc0;
  int c_00;
  Float in_stack_ffffffffffffffcc;
  RGBSpectrum *in_stack_ffffffffffffffd0;
  undefined1 auVar7 [56];
  undefined1 auVar10 [56];
  
  RGB::RGB((RGB *)&stack0xffffffffffffffcc);
  for (c_00 = 0; auVar10 = in_ZMM1._8_56_, c_00 < 3; c_00 = c_00 + 1) {
    in_stack_ffffffffffffffc0 = (RGB *)*in_RSI;
    WrapMode2D::WrapMode2D
              ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffff74,c_00),
               (WrapMode)((ulong)(in_RDI + 0xb8) >> 0x20));
    in_stack_ffffffffffffff74 =
         Image::LookupNearestChannel
                   (in_stack_ffffffffffffff80,(Point2f)in_stack_ffffffffffffff90,
                    (int)((ulong)in_RDI >> 0x20),(WrapMode2D)in_stack_ffffffffffffff88.values);
    pFVar4 = RGB::operator[]((RGB *)&stack0xffffffffffffffcc,c_00);
    *pFVar4 = in_stack_ffffffffffffff74;
  }
  a = *(Float *)(in_RDI + 0x1d8);
  auVar7 = (undefined1  [56])0x0;
  s = (SampledSpectrum *)&stack0xffffffffffffff80;
  RGBSpectrum::RGBSpectrum
            (in_stack_ffffffffffffffd0,(RGBColorSpace *)CONCAT44(in_stack_ffffffffffffffcc,c_00),
             in_stack_ffffffffffffffc0);
  SVar11 = RGBSpectrum::Sample(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar10;
  auVar5._0_8_ = SVar11.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  auVar7 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar8._0_16_);
  SVar11 = pbrt::operator*(a,s);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  uVar2 = vmovlpd_avx(auVar9._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::ImageLookup(
    const Point2f &st, const SampledWavelengths &lambda) const {
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);
    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}